

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

QMenu * __thiscall QLabelPrivate::createStandardContextMenu(QLabelPrivate *this,QPoint *pos)

{
  QPoint QVar1;
  QMenu *pQVar2;
  long in_FS_OFFSET;
  QPointF local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->control == (QWidgetTextControl *)0x0) {
    pQVar2 = (QMenu *)0x0;
  }
  else {
    QVar1 = layoutPoint(this,pos);
    local_20.xp = (qreal)QVar1.xp.m_i.m_i;
    local_20.yp = (qreal)QVar1.yp.m_i.m_i;
    pQVar2 = QWidgetTextControl::createStandardContextMenu
                       ((QWidgetTextControl *)this->control,&local_20,
                        *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QMenu *QLabelPrivate::createStandardContextMenu(const QPoint &pos)
{
    if (!control)
        return nullptr;

    const QPoint p = layoutPoint(pos);
    return control->createStandardContextMenu(p, q_func());
}